

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8.h
# Opt level: O3

void ncnn::conv3x3s1_winograd43_pack8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  int iVar10;
  size_t _elemsize;
  int *piVar11;
  void *pvVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [32];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  int iVar45;
  uint uVar46;
  float *pfVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  Mat *dst;
  uint uVar52;
  ulong uVar53;
  ulong uVar54;
  float *pfVar55;
  ulong uVar56;
  long lVar57;
  ulong uVar58;
  long lVar59;
  long lVar60;
  Option *opt_00;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  float fVar84;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 in_ZMM7 [64];
  float fVar94;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 in_ZMM8 [64];
  undefined1 auVar104 [32];
  ulong local_6f0;
  long local_6e8;
  undefined1 local_6e0 [16];
  Mat local_680;
  Option *local_630;
  Mat *local_628;
  Mat local_620;
  undefined8 local_5d8;
  ulong local_5d0;
  Mat *local_5c8;
  size_t local_5c0;
  Mat *local_5b8;
  long local_5b0;
  long local_5a8;
  long local_5a0;
  long local_598;
  undefined1 local_590 [16];
  undefined8 local_580;
  float afStack_578 [2];
  undefined8 local_570;
  float afStack_568 [2];
  undefined1 auStack_560 [12];
  size_t local_550;
  undefined1 local_540 [64];
  size_t local_500 [2];
  undefined1 local_4f0 [16];
  float afStack_4e0 [48];
  float afStack_420 [48];
  float afStack_360 [96];
  float afStack_1e0 [108];
  
  iVar49 = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  iVar10 = bottom_blob->elempack;
  uVar2 = top_blob->w;
  uVar4 = top_blob->h;
  auVar62._4_4_ = uVar4;
  auVar62._0_4_ = uVar2;
  iVar51 = top_blob->c;
  piVar11 = bottom_blob->refcount;
  local_620.data = bottom_blob->data;
  local_620.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_620.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_620.allocator = bottom_blob->allocator;
  iVar45 = bottom_blob->h;
  iVar48 = bottom_blob->w;
  uVar37 = bottom_blob->dims;
  uVar38 = bottom_blob->w;
  uVar39 = bottom_blob->h;
  uVar40 = bottom_blob->d;
  local_620.cstep = bottom_blob->cstep;
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + 1;
    UNLOCK();
    iVar48 = bottom_blob->w;
    iVar45 = bottom_blob->h;
  }
  auVar64._8_4_ = 3;
  auVar64._0_8_ = 0x300000003;
  auVar64._12_4_ = 3;
  auVar62._8_8_ = 0;
  auVar62 = vpaddd_avx(auVar62,auVar64);
  auVar65 = vpsrad_avx(auVar62,0x1f);
  auVar65 = vpsrld_avx(auVar65,0x1e);
  local_6e0 = vpaddd_avx(auVar62,auVar65);
  auVar61._8_4_ = 0xfffffffc;
  auVar61._0_8_ = 0xfffffffcfffffffc;
  auVar61._12_4_ = 0xfffffffc;
  local_4f0 = vpand_avx(local_6e0,auVar61);
  local_5d0 = (ulong)local_4f0._4_4_;
  local_5d8 = CONCAT44((int)(local_620.cstep >> 0x20),local_4f0._0_4_);
  auVar65 = local_6e0;
  local_620.elemsize = _elemsize;
  local_620.elempack = iVar10;
  local_620.dims = uVar37;
  local_620.w = uVar38;
  local_620.h = uVar39;
  local_620.d = uVar40;
  local_620.c = iVar49;
  local_5c8 = bias;
  local_5b8 = kernel_tm;
  copy_make_border(bottom_blob,&local_620,0,(local_4f0._4_4_ + 2) - iVar45,0,
                   (local_4f0._0_4_ + 2) - iVar48,0,0.0,opt);
  auVar62 = vpsrad_avx(local_6e0,2);
  local_550 = 0;
  local_590._0_8_ = (void *)0x0;
  local_590._8_4_ = 0;
  local_590._12_4_ = 0;
  local_580 = 0;
  afStack_578[0] = 0.0;
  local_570 = (Allocator *)0x0;
  afStack_568[0] = 0.0;
  afStack_568[1] = 0.0;
  auStack_560 = SUB1612((undefined1  [16])0x0,4);
  local_630 = opt;
  local_628 = top_blob;
  local_5c0 = _elemsize;
  Mat::create((Mat *)local_590,auVar62._4_4_ * auVar62._0_4_,0x24,iVar49,_elemsize,iVar10,
              opt->workspace_allocator);
  dst = local_628;
  opt_00 = local_630;
  if (0 < (long)local_620.c) {
    iVar49 = local_620.h + 1;
    if (-1 < local_620.h + -2) {
      iVar49 = local_620.h + -2;
    }
    uVar52 = iVar49 >> 2;
    iVar49 = local_620.w + 1;
    if (-1 < local_620.w + -2) {
      iVar49 = local_620.w + -2;
    }
    uVar46 = iVar49 >> 2;
    iVar49 = uVar46 * uVar52;
    uVar58 = 1;
    if (1 < (int)uVar46) {
      uVar58 = (ulong)uVar46;
    }
    if ((int)uVar52 < 2) {
      uVar52 = 1;
    }
    local_598 = (long)(iVar49 * 0x10) * 4;
    local_5a0 = (long)(iVar49 * 0x18) * 4;
    local_5b0 = (long)(iVar49 * 0x28) * 4;
    local_5a8 = (long)(iVar49 * 0x20) * 4;
    local_6e8 = 0;
    auVar65._8_4_ = 0xc0a00000;
    auVar65._0_8_ = 0xc0a00000c0a00000;
    auVar65._12_4_ = 0xc0a00000;
    do {
      if (5 < local_620.h) {
        lVar57 = local_580 * local_550 * local_6e8;
        local_6e0._0_8_ =
             (long)local_620.data + local_620.elemsize * local_620.cstep * local_6e8 + 0xa0;
        local_6f0 = 0;
        uVar54 = 0;
        do {
          if (5 < local_620.w) {
            uVar56 = 0;
            uVar53 = local_6f0;
            pfVar55 = (float *)local_6e0._0_8_;
            do {
              lVar59 = -0xc0;
              pfVar47 = pfVar55;
              do {
                auVar6 = *(undefined1 (*) [32])(pfVar47 + -0x20);
                auVar7 = *(undefined1 (*) [32])(pfVar47 + -0x18);
                auVar8 = *(undefined1 (*) [32])(pfVar47 + -0x10);
                auVar9 = *(undefined1 (*) [32])(pfVar47 + -8);
                auVar85._0_4_ = auVar7._0_4_ * -5.0 + pfVar47[-0x28] * 4.0 + auVar9._0_4_;
                auVar85._4_4_ = auVar7._4_4_ * -5.0 + pfVar47[-0x27] * 4.0 + auVar9._4_4_;
                auVar85._8_4_ = auVar7._8_4_ * -5.0 + pfVar47[-0x26] * 4.0 + auVar9._8_4_;
                auVar85._12_4_ = auVar7._12_4_ * -5.0 + pfVar47[-0x25] * 4.0 + auVar9._12_4_;
                auVar85._16_4_ = auVar7._16_4_ * -5.0 + pfVar47[-0x24] * 4.0 + auVar9._16_4_;
                auVar85._20_4_ = auVar7._20_4_ * -5.0 + pfVar47[-0x23] * 4.0 + auVar9._20_4_;
                auVar85._24_4_ = auVar7._24_4_ * -5.0 + pfVar47[-0x22] * 4.0 + auVar9._24_4_;
                auVar85._28_4_ = in_ZMM8._28_4_ + in_ZMM7._28_4_ + auVar9._28_4_;
                in_ZMM7 = ZEXT3264(auVar85);
                auVar95._0_4_ = auVar9._0_4_ + auVar8._0_4_ + (auVar7._0_4_ + auVar6._0_4_) * -4.0;
                auVar95._4_4_ = auVar9._4_4_ + auVar8._4_4_ + (auVar7._4_4_ + auVar6._4_4_) * -4.0;
                auVar95._8_4_ = auVar9._8_4_ + auVar8._8_4_ + (auVar7._8_4_ + auVar6._8_4_) * -4.0;
                auVar95._12_4_ =
                     auVar9._12_4_ + auVar8._12_4_ + (auVar7._12_4_ + auVar6._12_4_) * -4.0;
                auVar95._16_4_ =
                     auVar9._16_4_ + auVar8._16_4_ + (auVar7._16_4_ + auVar6._16_4_) * -4.0;
                auVar95._20_4_ =
                     auVar9._20_4_ + auVar8._20_4_ + (auVar7._20_4_ + auVar6._20_4_) * -4.0;
                auVar95._24_4_ =
                     auVar9._24_4_ + auVar8._24_4_ + (auVar7._24_4_ + auVar6._24_4_) * -4.0;
                auVar95._28_4_ = auVar9._28_4_ + auVar8._28_4_ + auVar7._28_4_ + auVar6._28_4_;
                in_ZMM8 = ZEXT3264(auVar95);
                auVar21 = vsubps_avx(auVar6,auVar7);
                auVar83 = vsubps_avx(auVar9,auVar8);
                auVar86 = vsubps_avx(auVar6,auVar8);
                auVar7 = vsubps_avx(auVar9,auVar7);
                auVar82._0_4_ = auVar86._0_4_ + auVar86._0_4_;
                auVar82._4_4_ = auVar86._4_4_ + auVar86._4_4_;
                auVar82._8_4_ = auVar86._8_4_ + auVar86._8_4_;
                auVar82._12_4_ = auVar86._12_4_ + auVar86._12_4_;
                auVar82._16_4_ = auVar86._16_4_ + auVar86._16_4_;
                auVar82._20_4_ = auVar86._20_4_ + auVar86._20_4_;
                auVar82._24_4_ = auVar86._24_4_ + auVar86._24_4_;
                auVar82._28_4_ = auVar86._28_4_ + auVar86._28_4_;
                auVar9 = vsubps_avx(auVar7,auVar82);
                fVar68 = *pfVar47;
                fVar69 = pfVar47[1];
                fVar66 = pfVar47[2];
                fVar67 = pfVar47[3];
                fVar70 = pfVar47[4];
                fVar71 = pfVar47[5];
                fVar72 = pfVar47[6];
                fVar73 = pfVar47[7];
                *(undefined1 (*) [32])((long)afStack_420 + lVar59) = auVar85;
                *(undefined1 (*) [32])((long)afStack_360 + lVar59) = auVar95;
                *(float *)((long)afStack_360 + lVar59 + 0xc0) = auVar83._0_4_ + auVar21._0_4_ * 4.0;
                *(float *)((long)afStack_360 + lVar59 + 0xc4) = auVar83._4_4_ + auVar21._4_4_ * 4.0;
                *(float *)((long)afStack_360 + lVar59 + 200) = auVar83._8_4_ + auVar21._8_4_ * 4.0;
                *(float *)((long)afStack_360 + lVar59 + 0xcc) =
                     auVar83._12_4_ + auVar21._12_4_ * 4.0;
                *(float *)((long)afStack_360 + lVar59 + 0xd0) =
                     auVar83._16_4_ + auVar21._16_4_ * 4.0;
                *(float *)((long)afStack_360 + lVar59 + 0xd4) =
                     auVar83._20_4_ + auVar21._20_4_ * 4.0;
                *(float *)((long)afStack_360 + lVar59 + 0xd8) =
                     auVar83._24_4_ + auVar21._24_4_ * 4.0;
                *(float *)((long)afStack_360 + lVar59 + 0xdc) = auVar83._28_4_ + auVar21._28_4_;
                *(undefined1 (*) [32])((long)afStack_1e0 + lVar59) = auVar9;
                *(float *)((long)afStack_1e0 + lVar59 + 0xc0) = auVar82._0_4_ + auVar7._0_4_;
                *(float *)((long)afStack_1e0 + lVar59 + 0xc4) = auVar82._4_4_ + auVar7._4_4_;
                *(float *)((long)afStack_1e0 + lVar59 + 200) = auVar82._8_4_ + auVar7._8_4_;
                *(float *)((long)afStack_1e0 + lVar59 + 0xcc) = auVar82._12_4_ + auVar7._12_4_;
                *(float *)((long)afStack_1e0 + lVar59 + 0xd0) = auVar82._16_4_ + auVar7._16_4_;
                *(float *)((long)afStack_1e0 + lVar59 + 0xd4) = auVar82._20_4_ + auVar7._20_4_;
                *(float *)((long)afStack_1e0 + lVar59 + 0xd8) = auVar82._24_4_ + auVar7._24_4_;
                *(float *)((long)afStack_1e0 + lVar59 + 0xdc) = auVar82._28_4_ + auVar7._28_4_;
                *(float *)((long)afStack_1e0 + lVar59 + 0x180) =
                     auVar8._0_4_ * -5.0 + auVar6._0_4_ * 4.0 + fVar68;
                *(float *)((long)afStack_1e0 + lVar59 + 0x184) =
                     auVar8._4_4_ * -5.0 + auVar6._4_4_ * 4.0 + fVar69;
                *(float *)((long)afStack_1e0 + lVar59 + 0x188) =
                     auVar8._8_4_ * -5.0 + auVar6._8_4_ * 4.0 + fVar66;
                *(float *)((long)afStack_1e0 + lVar59 + 0x18c) =
                     auVar8._12_4_ * -5.0 + auVar6._12_4_ * 4.0 + fVar67;
                *(float *)((long)afStack_1e0 + lVar59 + 400) =
                     auVar8._16_4_ * -5.0 + auVar6._16_4_ * 4.0 + fVar70;
                *(float *)((long)afStack_1e0 + lVar59 + 0x194) =
                     auVar8._20_4_ * -5.0 + auVar6._20_4_ * 4.0 + fVar71;
                *(float *)((long)afStack_1e0 + lVar59 + 0x198) =
                     auVar8._24_4_ * -5.0 + auVar6._24_4_ * 4.0 + fVar72;
                *(float *)((long)afStack_1e0 + lVar59 + 0x19c) =
                     auVar8._28_4_ + auVar6._28_4_ + fVar73;
                pfVar47 = pfVar47 + local_620.w * 8;
                lVar59 = lVar59 + 0x20;
              } while (lVar59 != 0);
              lVar60 = 0xa0;
              lVar59 = uVar53;
              do {
                auVar6 = *(undefined1 (*) [32])(auStack_560 + lVar60);
                auVar7 = *(undefined1 (*) [32])(local_540 + lVar60);
                auVar8 = *(undefined1 (*) [32])(local_540 + lVar60 + 0x20);
                auVar9 = *(undefined1 (*) [32])((long)local_500 + lVar60);
                auVar86._0_4_ =
                     auVar7._0_4_ * -5.0 + *(float *)((long)&local_580 + lVar60) * 4.0 +
                     auVar9._0_4_;
                auVar86._4_4_ =
                     auVar7._4_4_ * -5.0 + *(float *)((long)&local_580 + lVar60 + 4) * 4.0 +
                     auVar9._4_4_;
                auVar86._8_4_ =
                     auVar7._8_4_ * -5.0 + *(float *)((long)afStack_578 + lVar60) * 4.0 +
                     auVar9._8_4_;
                auVar86._12_4_ =
                     auVar7._12_4_ * -5.0 + *(float *)((long)afStack_578 + lVar60 + 4) * 4.0 +
                     auVar9._12_4_;
                auVar86._16_4_ =
                     auVar7._16_4_ * -5.0 + *(float *)((long)&local_570 + lVar60) * 4.0 +
                     auVar9._16_4_;
                auVar86._20_4_ =
                     auVar7._20_4_ * -5.0 + *(float *)((long)&local_570 + lVar60 + 4) * 4.0 +
                     auVar9._20_4_;
                auVar86._24_4_ =
                     auVar7._24_4_ * -5.0 + *(float *)((long)afStack_568 + lVar60) * 4.0 +
                     auVar9._24_4_;
                auVar86._28_4_ = in_ZMM8._28_4_ + in_ZMM7._28_4_ + auVar9._28_4_;
                in_ZMM7 = ZEXT3264(auVar86);
                auVar96._0_4_ = auVar9._0_4_ + auVar8._0_4_ + (auVar7._0_4_ + auVar6._0_4_) * -4.0;
                auVar96._4_4_ = auVar9._4_4_ + auVar8._4_4_ + (auVar7._4_4_ + auVar6._4_4_) * -4.0;
                auVar96._8_4_ = auVar9._8_4_ + auVar8._8_4_ + (auVar7._8_4_ + auVar6._8_4_) * -4.0;
                auVar96._12_4_ =
                     auVar9._12_4_ + auVar8._12_4_ + (auVar7._12_4_ + auVar6._12_4_) * -4.0;
                auVar96._16_4_ =
                     auVar9._16_4_ + auVar8._16_4_ + (auVar7._16_4_ + auVar6._16_4_) * -4.0;
                auVar96._20_4_ =
                     auVar9._20_4_ + auVar8._20_4_ + (auVar7._20_4_ + auVar6._20_4_) * -4.0;
                auVar96._24_4_ =
                     auVar9._24_4_ + auVar8._24_4_ + (auVar7._24_4_ + auVar6._24_4_) * -4.0;
                auVar96._28_4_ = auVar9._28_4_ + auVar8._28_4_ + auVar7._28_4_ + auVar6._28_4_;
                in_ZMM8 = ZEXT3264(auVar96);
                auVar21 = vsubps_avx(auVar6,auVar7);
                auVar83 = vsubps_avx(auVar9,auVar8);
                auVar104._0_4_ = auVar83._0_4_ + auVar21._0_4_ * 4.0;
                auVar104._4_4_ = auVar83._4_4_ + auVar21._4_4_ * 4.0;
                auVar104._8_4_ = auVar83._8_4_ + auVar21._8_4_ * 4.0;
                auVar104._12_4_ = auVar83._12_4_ + auVar21._12_4_ * 4.0;
                auVar104._16_4_ = auVar83._16_4_ + auVar21._16_4_ * 4.0;
                auVar104._20_4_ = auVar83._20_4_ + auVar21._20_4_ * 4.0;
                auVar104._24_4_ = auVar83._24_4_ + auVar21._24_4_ * 4.0;
                auVar104._28_4_ = auVar83._28_4_ + auVar21._28_4_;
                auVar21 = vsubps_avx(auVar6,auVar8);
                auVar7 = vsubps_avx(auVar9,auVar7);
                auVar83._0_4_ = auVar21._0_4_ + auVar21._0_4_;
                auVar83._4_4_ = auVar21._4_4_ + auVar21._4_4_;
                auVar83._8_4_ = auVar21._8_4_ + auVar21._8_4_;
                auVar83._12_4_ = auVar21._12_4_ + auVar21._12_4_;
                auVar83._16_4_ = auVar21._16_4_ + auVar21._16_4_;
                auVar83._20_4_ = auVar21._20_4_ + auVar21._20_4_;
                auVar83._24_4_ = auVar21._24_4_ + auVar21._24_4_;
                auVar83._28_4_ = auVar21._28_4_ + auVar21._28_4_;
                auVar9 = vsubps_avx(auVar7,auVar83);
                fVar68 = *(float *)((long)afStack_4e0 + lVar60);
                fVar69 = *(float *)((long)afStack_4e0 + lVar60 + 4);
                fVar66 = *(float *)((long)afStack_4e0 + lVar60 + 8);
                fVar67 = *(float *)((long)afStack_4e0 + lVar60 + 0xc);
                fVar70 = *(float *)((long)afStack_4e0 + lVar60 + 0x10);
                fVar71 = *(float *)((long)afStack_4e0 + lVar60 + 0x14);
                fVar72 = *(float *)((long)afStack_4e0 + lVar60 + 0x18);
                fVar73 = *(float *)((long)afStack_4e0 + lVar60 + 0x1c);
                *(undefined1 (*) [32])(local_590._0_8_ + lVar59 + lVar57) = auVar86;
                *(undefined1 (*) [32])(local_590._0_8_ + lVar59 + (long)(iVar49 * 8) * 4 + lVar57) =
                     auVar96;
                *(undefined1 (*) [32])(local_590._0_8_ + lVar59 + local_598 + lVar57) = auVar104;
                *(undefined1 (*) [32])(local_590._0_8_ + lVar59 + local_5a0 + lVar57) = auVar9;
                pfVar47 = (float *)(local_590._0_8_ + lVar59 + local_5a8 + lVar57);
                *pfVar47 = auVar83._0_4_ + auVar7._0_4_;
                pfVar47[1] = auVar83._4_4_ + auVar7._4_4_;
                pfVar47[2] = auVar83._8_4_ + auVar7._8_4_;
                pfVar47[3] = auVar83._12_4_ + auVar7._12_4_;
                pfVar47[4] = auVar83._16_4_ + auVar7._16_4_;
                pfVar47[5] = auVar83._20_4_ + auVar7._20_4_;
                pfVar47[6] = auVar83._24_4_ + auVar7._24_4_;
                pfVar47[7] = auVar83._28_4_ + auVar7._28_4_;
                pfVar47 = (float *)(local_590._0_8_ + lVar59 + local_5b0 + lVar57);
                *pfVar47 = auVar8._0_4_ * -5.0 + auVar6._0_4_ * 4.0 + fVar68;
                pfVar47[1] = auVar8._4_4_ * -5.0 + auVar6._4_4_ * 4.0 + fVar69;
                pfVar47[2] = auVar8._8_4_ * -5.0 + auVar6._8_4_ * 4.0 + fVar66;
                pfVar47[3] = auVar8._12_4_ * -5.0 + auVar6._12_4_ * 4.0 + fVar67;
                pfVar47[4] = auVar8._16_4_ * -5.0 + auVar6._16_4_ * 4.0 + fVar70;
                pfVar47[5] = auVar8._20_4_ * -5.0 + auVar6._20_4_ * 4.0 + fVar71;
                pfVar47[6] = auVar8._24_4_ * -5.0 + auVar6._24_4_ * 4.0 + fVar72;
                pfVar47[7] = auVar8._28_4_ + auVar6._28_4_ + fVar73;
                lVar60 = lVar60 + 0xc0;
                lVar59 = lVar59 + (long)(iVar49 * 0x30) * 4;
              } while (lVar60 != 0x520);
              uVar56 = uVar56 + 1;
              pfVar55 = pfVar55 + 0x20;
              uVar53 = uVar53 + 0x20;
            } while (uVar56 != uVar58);
          }
          uVar54 = uVar54 + 1;
          local_6e0._0_8_ = (float *)(local_6e0._0_8_ + (long)local_620.w * local_620.elemsize * 4);
          local_6f0 = local_6f0 + (long)(int)uVar46 * 0x20;
        } while (uVar54 != uVar52);
      }
      local_6e8 = local_6e8 + 1;
    } while (local_6e8 != local_620.c);
  }
  piVar11 = (int *)CONCAT44(local_620.refcount._4_4_,local_620.refcount._0_4_);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_620.allocator == (Allocator *)0x0) {
        if (local_620.data != (void *)0x0) {
          free(local_620.data);
        }
      }
      else {
        (*(local_620.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_620.cstep = 0;
  local_620.data = (void *)0x0;
  local_620.refcount._0_4_ = 0;
  local_620.refcount._4_4_ = 0;
  local_620.elemsize = 0;
  local_620.elempack = 0;
  local_620.h = 0;
  local_620.d = 0;
  local_620.c = 0;
  local_620.allocator = (Allocator *)0x0;
  local_620.dims = 0;
  local_620.w = 0;
  local_500[0] = 0;
  local_540._0_8_ = (void *)0x0;
  local_540._8_4_ = 0;
  local_540._12_4_ = 0;
  local_540._16_8_ = 0;
  local_540._24_4_ = 0;
  local_540._32_8_ = (Allocator *)0x0;
  local_540._40_4_ = 0;
  local_540._44_4_ = 0;
  local_540._48_12_ = SUB1612((undefined1  [16])0x0,4);
  convolution_winograd_dot_pack8_avx((Mat *)local_590,iVar51,local_5b8,(Mat *)local_540,opt_00);
  local_680.cstep = 0;
  local_680.data = (void *)0x0;
  local_680.refcount._0_4_ = 0;
  local_680.refcount._4_4_ = 0;
  local_680.elemsize = 0;
  local_680.elempack = 0;
  local_680.allocator = (Allocator *)0x0;
  local_680.dims = 0;
  local_680.w = 0;
  local_680.h = 0;
  local_680.d = 0;
  local_680.c = 0;
  uVar3 = dst->w;
  uVar5 = dst->h;
  auVar63._4_4_ = uVar5;
  auVar63._0_4_ = uVar3;
  auVar63._8_8_ = 0;
  auVar62 = vpcmpeqd_avx(auVar63,local_4f0);
  auVar61 = vpmovsxdq_avx(auVar62);
  auVar62 = vpcmpeqd_avx(auVar65,auVar65);
  if (((auVar62 & ~auVar61) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
      -1 < SUB161(auVar62 & ~auVar61,0xf)) {
    if (&local_680 == dst) {
      iVar51 = 0;
      iVar45 = 0;
      goto LAB_0025bf5d;
    }
    piVar11 = dst->refcount;
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + 1;
      UNLOCK();
    }
    local_680.data = dst->data;
    local_680.refcount._0_4_ = SUB84(dst->refcount,0);
    local_680.refcount._4_4_ = (undefined4)((ulong)dst->refcount >> 0x20);
    local_680.elemsize = dst->elemsize;
    local_680.elempack = dst->elempack;
    local_680.allocator = dst->allocator;
    uVar41 = dst->dims;
    uVar42 = dst->w;
    uVar43 = dst->h;
    uVar44 = dst->d;
    local_680.c = dst->c;
    local_680.cstep = dst->cstep;
    iVar10 = dst->w;
    iVar49 = dst->h;
    local_680.dims = uVar41;
    local_680.w = uVar42;
    local_680.h = uVar43;
    local_680.d = uVar44;
  }
  else {
    Mat::create(&local_680,(int)local_5d8,(int)local_5d0,iVar51,local_5c0,iVar10,
                opt_00->workspace_allocator);
    iVar10 = local_680.w;
    iVar49 = local_680.h;
  }
  iVar51 = iVar49;
  iVar45 = iVar10;
  if (0 < local_680.c) {
    iVar48 = iVar49 + 3;
    if (-1 < iVar49) {
      iVar48 = iVar49;
    }
    iVar51 = iVar10 + 3;
    if (-1 < iVar10) {
      iVar51 = iVar10;
    }
    pvVar12 = local_5c8->data;
    uVar52 = iVar51 >> 2;
    iVar50 = uVar52 * (iVar48 >> 2);
    uVar58 = 0;
    do {
      if (pvVar12 == (void *)0x0) {
        fVar68 = 0.0;
        fVar69 = 0.0;
        fVar66 = 0.0;
        fVar67 = 0.0;
        fVar70 = 0.0;
        fVar71 = 0.0;
        fVar72 = 0.0;
        fVar73 = 0.0;
      }
      else {
        pfVar55 = (float *)((long)pvVar12 + uVar58 * 0x20);
        fVar66 = *pfVar55;
        fVar67 = pfVar55[1];
        fVar68 = pfVar55[2];
        fVar69 = pfVar55[3];
        fVar70 = pfVar55[4];
        fVar71 = pfVar55[5];
        fVar72 = pfVar55[6];
        fVar73 = pfVar55[7];
      }
      if (3 < iVar49) {
        local_6e0._0_8_ =
             (long)local_680.data + local_680.elemsize * local_680.cstep * uVar58 + 0x60;
        local_6f0 = 0;
        uVar54 = 0;
        do {
          if (3 < iVar10) {
            uVar56 = 0;
            uVar53 = local_6f0;
            pfVar55 = (float *)local_6e0._0_8_;
            do {
              pfVar47 = (float *)(local_540._0_8_ +
                                 (uVar53 >> 3 & 0x1fffffff) * 0x20 +
                                 local_540._16_8_ * local_500[0] * uVar58);
              lVar57 = -0xc0;
              do {
                auVar6 = *(undefined1 (*) [32])(pfVar47 + iVar50 * 8);
                auVar7 = *(undefined1 (*) [32])(pfVar47 + iVar50 * 0x10);
                auVar8 = *(undefined1 (*) [32])(pfVar47 + iVar50 * 0x18);
                auVar9 = *(undefined1 (*) [32])(pfVar47 + iVar50 * 0x20);
                fVar84 = auVar7._0_4_ + auVar6._0_4_;
                fVar87 = auVar7._4_4_ + auVar6._4_4_;
                fVar88 = auVar7._8_4_ + auVar6._8_4_;
                fVar89 = auVar7._12_4_ + auVar6._12_4_;
                fVar90 = auVar7._16_4_ + auVar6._16_4_;
                fVar91 = auVar7._20_4_ + auVar6._20_4_;
                fVar92 = auVar7._24_4_ + auVar6._24_4_;
                fVar93 = auVar7._28_4_ + auVar6._28_4_;
                auVar6 = vsubps_avx(auVar6,auVar7);
                fVar74 = auVar9._0_4_ + auVar8._0_4_;
                fVar75 = auVar9._4_4_ + auVar8._4_4_;
                fVar76 = auVar9._8_4_ + auVar8._8_4_;
                fVar77 = auVar9._12_4_ + auVar8._12_4_;
                fVar78 = auVar9._16_4_ + auVar8._16_4_;
                fVar79 = auVar9._20_4_ + auVar8._20_4_;
                fVar80 = auVar9._24_4_ + auVar8._24_4_;
                fVar81 = auVar9._28_4_ + auVar8._28_4_;
                fVar22 = pfVar47[1];
                fVar23 = pfVar47[2];
                fVar24 = pfVar47[3];
                fVar25 = pfVar47[4];
                fVar26 = pfVar47[5];
                fVar27 = pfVar47[6];
                fVar28 = pfVar47[7];
                auVar7 = vsubps_avx(auVar8,auVar9);
                fVar13 = auVar7._0_4_;
                fVar14 = auVar7._4_4_;
                fVar15 = auVar7._8_4_;
                fVar16 = auVar7._12_4_;
                fVar17 = auVar7._16_4_;
                fVar18 = auVar7._20_4_;
                fVar19 = auVar7._24_4_;
                fVar20 = auVar7._28_4_;
                pfVar1 = pfVar47 + iVar50 * 0x28;
                fVar29 = *pfVar1;
                fVar30 = pfVar1[1];
                fVar31 = pfVar1[2];
                fVar32 = pfVar1[3];
                fVar33 = pfVar1[4];
                fVar34 = pfVar1[5];
                fVar35 = pfVar1[6];
                fVar36 = pfVar1[7];
                *(float *)((long)afStack_420 + lVar57) = fVar84 + *pfVar47 + fVar74;
                *(float *)((long)afStack_420 + lVar57 + 4) = fVar87 + fVar22 + fVar75;
                *(float *)((long)afStack_420 + lVar57 + 8) = fVar88 + fVar23 + fVar76;
                *(float *)((long)afStack_420 + lVar57 + 0xc) = fVar89 + fVar24 + fVar77;
                *(float *)((long)afStack_420 + lVar57 + 0x10) = fVar90 + fVar25 + fVar78;
                *(float *)((long)afStack_420 + lVar57 + 0x14) = fVar91 + fVar26 + fVar79;
                *(float *)((long)afStack_420 + lVar57 + 0x18) = fVar92 + fVar27 + fVar80;
                *(float *)((long)afStack_420 + lVar57 + 0x1c) = fVar93 + fVar28 + fVar81;
                *(float *)((long)afStack_360 + lVar57) = fVar13 + fVar13 + auVar6._0_4_;
                *(float *)((long)afStack_360 + lVar57 + 4) = fVar14 + fVar14 + auVar6._4_4_;
                *(float *)((long)afStack_360 + lVar57 + 8) = fVar15 + fVar15 + auVar6._8_4_;
                *(float *)((long)afStack_360 + lVar57 + 0xc) = fVar16 + fVar16 + auVar6._12_4_;
                *(float *)((long)afStack_360 + lVar57 + 0x10) = fVar17 + fVar17 + auVar6._16_4_;
                *(float *)((long)afStack_360 + lVar57 + 0x14) = fVar18 + fVar18 + auVar6._20_4_;
                *(float *)((long)afStack_360 + lVar57 + 0x18) = fVar19 + fVar19 + auVar6._24_4_;
                *(float *)((long)afStack_360 + lVar57 + 0x1c) = fVar20 + fVar20 + auVar6._28_4_;
                *(float *)((long)afStack_360 + lVar57 + 0xc0) = fVar74 * 4.0 + fVar84;
                *(float *)((long)afStack_360 + lVar57 + 0xc4) = fVar75 * 4.0 + fVar87;
                *(float *)((long)afStack_360 + lVar57 + 200) = fVar76 * 4.0 + fVar88;
                *(float *)((long)afStack_360 + lVar57 + 0xcc) = fVar77 * 4.0 + fVar89;
                *(float *)((long)afStack_360 + lVar57 + 0xd0) = fVar78 * 4.0 + fVar90;
                *(float *)((long)afStack_360 + lVar57 + 0xd4) = fVar79 * 4.0 + fVar91;
                *(float *)((long)afStack_360 + lVar57 + 0xd8) = fVar80 * 4.0 + fVar92;
                *(float *)((long)afStack_360 + lVar57 + 0xdc) = fVar81 + fVar93;
                *(float *)((long)afStack_1e0 + lVar57) = auVar6._0_4_ + fVar29 + fVar13 * 8.0;
                *(float *)((long)afStack_1e0 + lVar57 + 4) = auVar6._4_4_ + fVar30 + fVar14 * 8.0;
                *(float *)((long)afStack_1e0 + lVar57 + 8) = auVar6._8_4_ + fVar31 + fVar15 * 8.0;
                *(float *)((long)afStack_1e0 + lVar57 + 0xc) = auVar6._12_4_ + fVar32 + fVar16 * 8.0
                ;
                *(float *)((long)afStack_1e0 + lVar57 + 0x10) =
                     auVar6._16_4_ + fVar33 + fVar17 * 8.0;
                *(float *)((long)afStack_1e0 + lVar57 + 0x14) =
                     auVar6._20_4_ + fVar34 + fVar18 * 8.0;
                *(float *)((long)afStack_1e0 + lVar57 + 0x18) =
                     auVar6._24_4_ + fVar35 + fVar19 * 8.0;
                *(float *)((long)afStack_1e0 + lVar57 + 0x1c) = auVar6._28_4_ + fVar36 + fVar20;
                pfVar47 = pfVar47 + iVar50 * 0x30;
                lVar57 = lVar57 + 0x20;
              } while (lVar57 != 0);
              lVar57 = 0xa0;
              pfVar47 = pfVar55;
              do {
                auVar6 = *(undefined1 (*) [32])(auStack_560 + lVar57);
                auVar7 = *(undefined1 (*) [32])(local_540 + lVar57);
                auVar8 = *(undefined1 (*) [32])(local_540 + lVar57 + 0x20);
                auVar9 = *(undefined1 (*) [32])((long)local_500 + lVar57);
                auVar21 = vsubps_avx(auVar6,auVar7);
                fVar94 = auVar9._0_4_ + auVar8._0_4_;
                fVar97 = auVar9._4_4_ + auVar8._4_4_;
                fVar98 = auVar9._8_4_ + auVar8._8_4_;
                fVar99 = auVar9._12_4_ + auVar8._12_4_;
                fVar100 = auVar9._16_4_ + auVar8._16_4_;
                fVar101 = auVar9._20_4_ + auVar8._20_4_;
                fVar102 = auVar9._24_4_ + auVar8._24_4_;
                fVar103 = auVar9._28_4_ + auVar8._28_4_;
                auVar8 = vsubps_avx(auVar8,auVar9);
                fVar74 = auVar6._0_4_ + fVar66 + auVar7._0_4_;
                fVar75 = auVar6._4_4_ + fVar67 + auVar7._4_4_;
                fVar76 = auVar6._8_4_ + fVar68 + auVar7._8_4_;
                fVar77 = auVar6._12_4_ + fVar69 + auVar7._12_4_;
                fVar78 = auVar6._16_4_ + fVar70 + auVar7._16_4_;
                fVar79 = auVar6._20_4_ + fVar71 + auVar7._20_4_;
                fVar80 = auVar6._24_4_ + fVar72 + auVar7._24_4_;
                fVar81 = auVar6._28_4_ + fVar73 + auVar7._28_4_;
                fVar22 = *(float *)((long)&local_580 + lVar57 + 4);
                fVar23 = *(float *)((long)afStack_578 + lVar57);
                fVar24 = *(float *)((long)afStack_578 + lVar57 + 4);
                fVar25 = *(float *)((long)&local_570 + lVar57);
                fVar26 = *(float *)((long)&local_570 + lVar57 + 4);
                fVar27 = *(float *)((long)afStack_568 + lVar57);
                fVar28 = *(float *)(auStack_560 + lVar57 + -4);
                fVar13 = auVar8._0_4_;
                fVar14 = auVar8._4_4_;
                fVar15 = auVar8._8_4_;
                fVar16 = auVar8._12_4_;
                fVar17 = auVar8._16_4_;
                fVar18 = auVar8._20_4_;
                fVar19 = auVar8._24_4_;
                fVar20 = auVar8._28_4_;
                fVar84 = auVar21._0_4_ + fVar66;
                fVar87 = auVar21._4_4_ + fVar67;
                fVar88 = auVar21._8_4_ + fVar68;
                fVar89 = auVar21._12_4_ + fVar69;
                fVar90 = auVar21._16_4_ + fVar70;
                fVar91 = auVar21._20_4_ + fVar71;
                fVar92 = auVar21._24_4_ + fVar72;
                fVar93 = auVar21._28_4_ + fVar73;
                fVar29 = *(float *)((long)afStack_4e0 + lVar57);
                fVar30 = *(float *)((long)afStack_4e0 + lVar57 + 4);
                fVar31 = *(float *)((long)afStack_4e0 + lVar57 + 8);
                fVar32 = *(float *)((long)afStack_4e0 + lVar57 + 0xc);
                fVar33 = *(float *)((long)afStack_4e0 + lVar57 + 0x10);
                fVar34 = *(float *)((long)afStack_4e0 + lVar57 + 0x14);
                fVar35 = *(float *)((long)afStack_4e0 + lVar57 + 0x18);
                fVar36 = *(float *)((long)afStack_4e0 + lVar57 + 0x1c);
                pfVar47[-0x18] = fVar94 + fVar74 + *(float *)((long)&local_580 + lVar57);
                pfVar47[-0x17] = fVar97 + fVar75 + fVar22;
                pfVar47[-0x16] = fVar98 + fVar76 + fVar23;
                pfVar47[-0x15] = fVar99 + fVar77 + fVar24;
                pfVar47[-0x14] = fVar100 + fVar78 + fVar25;
                pfVar47[-0x13] = fVar101 + fVar79 + fVar26;
                pfVar47[-0x12] = fVar102 + fVar80 + fVar27;
                pfVar47[-0x11] = fVar103 + fVar81 + fVar28;
                pfVar47[-0x10] = fVar13 + fVar13 + fVar84;
                pfVar47[-0xf] = fVar14 + fVar14 + fVar87;
                pfVar47[-0xe] = fVar15 + fVar15 + fVar88;
                pfVar47[-0xd] = fVar16 + fVar16 + fVar89;
                pfVar47[-0xc] = fVar17 + fVar17 + fVar90;
                pfVar47[-0xb] = fVar18 + fVar18 + fVar91;
                pfVar47[-10] = fVar19 + fVar19 + fVar92;
                pfVar47[-9] = fVar20 + fVar20 + fVar93;
                pfVar47[-8] = fVar94 * 4.0 + fVar74;
                pfVar47[-7] = fVar97 * 4.0 + fVar75;
                pfVar47[-6] = fVar98 * 4.0 + fVar76;
                pfVar47[-5] = fVar99 * 4.0 + fVar77;
                pfVar47[-4] = fVar100 * 4.0 + fVar78;
                pfVar47[-3] = fVar101 * 4.0 + fVar79;
                pfVar47[-2] = fVar102 * 4.0 + fVar80;
                pfVar47[-1] = fVar103 + fVar81;
                *pfVar47 = fVar84 + fVar29 + fVar13 * 8.0;
                pfVar47[1] = fVar87 + fVar30 + fVar14 * 8.0;
                pfVar47[2] = fVar88 + fVar31 + fVar15 * 8.0;
                pfVar47[3] = fVar89 + fVar32 + fVar16 * 8.0;
                pfVar47[4] = fVar90 + fVar33 + fVar17 * 8.0;
                pfVar47[5] = fVar91 + fVar34 + fVar18 * 8.0;
                pfVar47[6] = fVar92 + fVar35 + fVar19 * 8.0;
                pfVar47[7] = fVar93 + fVar36 + fVar20;
                lVar57 = lVar57 + 0xc0;
                pfVar47 = pfVar47 + iVar10 * 8;
              } while (lVar57 != 0x3a0);
              uVar56 = uVar56 + 1;
              uVar53 = uVar53 + 8;
              pfVar55 = pfVar55 + 0x20;
            } while (uVar56 != uVar52);
          }
          uVar54 = uVar54 + 1;
          local_6f0 = local_6f0 + (ulong)uVar52 * 8;
          local_6e0._0_8_ = (float *)(local_6e0._0_8_ + (long)local_680.w * local_680.elemsize * 4);
        } while (uVar54 != (uint)(iVar48 >> 2));
      }
      uVar58 = uVar58 + 1;
      dst = local_628;
      opt_00 = local_630;
      iVar51 = local_680.h;
      iVar45 = local_680.w;
    } while (uVar58 != (uint)local_680.c);
  }
LAB_0025bf5d:
  copy_cut_border(&local_680,dst,0,iVar51 - dst->h,0,iVar45 - dst->w,opt_00);
  piVar11 = (int *)CONCAT44(local_680.refcount._4_4_,local_680.refcount._0_4_);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_680.allocator == (Allocator *)0x0) {
        if (local_680.data != (void *)0x0) {
          free(local_680.data);
        }
      }
      else {
        (*(local_680.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar11 = (int *)CONCAT44(local_540._12_4_,local_540._8_4_);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if ((Allocator *)local_540._32_8_ == (Allocator *)0x0) {
        if ((void *)local_540._0_8_ != (void *)0x0) {
          free((void *)local_540._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_540._32_8_)[3])();
      }
    }
  }
  piVar11 = (int *)CONCAT44(local_590._12_4_,local_590._8_4_);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_570 == (Allocator *)0x0) {
        if ((void *)local_590._0_8_ != (void *)0x0) {
          free((void *)local_590._0_8_);
        }
      }
      else {
        (*local_570->_vptr_Allocator[3])();
      }
    }
  }
  piVar11 = (int *)CONCAT44(local_620.refcount._4_4_,local_620.refcount._0_4_);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_620.allocator == (Allocator *)0x0) {
        if (local_620.data != (void *)0x0) {
          free(local_620.data);
        }
      }
      else {
        (*(local_620.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 4n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 3) / 4 * 4;
    outh = (outh + 3) / 4 * 4;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 4;
        int h_tiles = outh / 4;
        const int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 36, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd43_transform_input_pack8_avx(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_pack8_avx(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, elemsize, elempack, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd43_transform_output_pack8_avx(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}